

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O3

void __thiscall helics::apps::Recorder::processArgs(Recorder *this)

{
  shared_ptr<helics::helicsCLI11App> app;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  buildArgParserApp((Recorder *)local_60);
  if ((this->super_App).deactivated == false) {
    if (((App *)local_60._0_8_)->parsed_ != 0) {
      CLI::App::clear((App *)local_60._0_8_);
    }
    ((App *)local_60._0_8_)->parsed_ = 1;
    CLI::App::_validate((App *)local_60._0_8_);
    CLI::App::_configure((App *)local_60._0_8_);
    ((App *)local_60._0_8_)->parent_ = (App *)0x0;
    ((App *)local_60._0_8_)->parsed_ = 0;
    CLI::App::_parse((App *)local_60._0_8_,&(this->super_App).remArgs);
    CLI::App::run_callback((App *)local_60._0_8_,false,false);
  }
  else if ((this->super_App).helpMode == true) {
    helicsCLI11App::remove_helics_specifics((helicsCLI11App *)local_60._0_8_);
    local_50._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_60 + 0x10),"");
    CLI::App::help((string *)&local_30,(App *)local_60._0_8_,(string *)(local_60 + 0x10),Normal);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_30._M_allocated_capacity,local_30._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_allocated_capacity != &local_20) {
      operator_delete((void *)local_30._M_allocated_capacity,
                      (ulong)(local_20._M_allocated_capacity + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,(ulong)((long)local_40._vptr__Sp_counted_base + 1));
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  return;
}

Assistant:

void Recorder::processArgs()
{
    auto app = buildArgParserApp();
    if (!deactivated) {
        app->parse(remArgs);
    } else if (helpMode) {
        app->remove_helics_specifics();
        std::cout << app->help();
    }
}